

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterEndDTD(xmlTextWriterPtr writer)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk;
  void *pvVar3;
  int iVar4;
  
  iVar2 = -1;
  if (writer != (xmlTextWriterPtr)0x0) {
    iVar4 = 0;
    do {
      lk = xmlListFront(writer->nodes);
      if (lk == (xmlLinkPtr)0x0) {
        return iVar4;
      }
      pvVar3 = xmlLinkGetData(lk);
      if (pvVar3 == (void *)0x0) {
        return iVar4;
      }
      iVar2 = iVar4;
      switch(*(undefined4 *)((long)pvVar3 + 8)) {
      case 8:
        iVar2 = xmlOutputBufferWriteString(writer->out,"]");
        if (iVar2 < 0) {
          return -1;
        }
        iVar4 = iVar4 + iVar2;
      case 7:
        iVar1 = xmlOutputBufferWriteString(writer->out,">");
        if (writer->indent != 0) {
          if (iVar1 < 0) {
            return -1;
          }
          iVar4 = iVar4 + iVar1;
          iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
        }
        xmlListPopFront(writer->nodes);
        break;
      case 9:
      case 10:
        iVar1 = xmlTextWriterEndDTDElement(writer);
        break;
      case 0xb:
      case 0xc:
        iVar1 = xmlTextWriterEndDTDAttlist(writer);
        break;
      case 0xd:
      case 0xe:
      case 0xf:
        iVar1 = xmlTextWriterEndDTDEntity(writer);
        break;
      case 0x10:
        iVar1 = xmlTextWriterEndComment(writer);
        break;
      default:
        goto switchD_001b294c_default;
      }
      iVar4 = iVar4 + iVar1;
      iVar2 = -1;
    } while (-1 < iVar1);
  }
switchD_001b294c_default:
  return iVar2;
}

Assistant:

int
xmlTextWriterEndDTD(xmlTextWriterPtr writer)
{
    int loop;
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL)
        return -1;

    sum = 0;
    loop = 1;
    while (loop) {
        lk = xmlListFront(writer->nodes);
        if (lk == NULL)
            break;
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p == 0)
            break;
        switch (p->state) {
            case XML_TEXTWRITER_DTD_TEXT:
                count = xmlOutputBufferWriteString(writer->out, "]");
                if (count < 0)
                    return -1;
                sum += count;
                /* fallthrough */
            case XML_TEXTWRITER_DTD:
                count = xmlOutputBufferWriteString(writer->out, ">");

                if (writer->indent) {
                    if (count < 0)
                        return -1;
                    sum += count;
                    count = xmlOutputBufferWriteString(writer->out, "\n");
                }

                xmlListPopFront(writer->nodes);
                break;
            case XML_TEXTWRITER_DTD_ELEM:
            case XML_TEXTWRITER_DTD_ELEM_TEXT:
                count = xmlTextWriterEndDTDElement(writer);
                break;
            case XML_TEXTWRITER_DTD_ATTL:
            case XML_TEXTWRITER_DTD_ATTL_TEXT:
                count = xmlTextWriterEndDTDAttlist(writer);
                break;
            case XML_TEXTWRITER_DTD_ENTY:
            case XML_TEXTWRITER_DTD_PENT:
            case XML_TEXTWRITER_DTD_ENTY_TEXT:
                count = xmlTextWriterEndDTDEntity(writer);
                break;
            case XML_TEXTWRITER_COMMENT:
                count = xmlTextWriterEndComment(writer);
                break;
            default:
                loop = 0;
                continue;
        }

        if (count < 0)
            return -1;
        sum += count;
    }

    return sum;
}